

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

int CompareDouble(double a,double b)

{
  if (a < b) {
    return -1;
  }
  if (b < a) {
    return 1;
  }
  if ((a != b) || (NAN(a) || NAN(b))) {
    if (NAN(a)) {
      return -(uint)!NAN(b);
    }
    if (NAN(b)) {
      return -1;
    }
  }
  return 0;
}

Assistant:

static int CompareDouble( double a, double b )
{
  return ( ( a < b ) ? -1 : ((a > b) ? 1 : (a==b ? 0 : CompareNans(a,b)) ) );
}